

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_healthy_m(REF_DBL *m)

{
  uint uVar1;
  REF_DBL system [12];
  double local_78;
  double local_70;
  double local_68;
  
  uVar1 = ref_matrix_diag_m(m,&local_78);
  if (uVar1 == 0) {
    if (((local_78 < -1e-15) || (local_70 < -1e-15)) || (uVar1 = 0, local_68 < -1e-15)) {
      printf("eigs %e %e %e\n");
      ref_matrix_show_m(m);
      uVar1 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x300,
           "ref_matrix_healthy_m",(ulong)uVar1,"diag");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_healthy_m(REF_DBL *m) {
  REF_DBL system[12];
  REF_DBL floor = -1.0e-15;
  RSS(ref_matrix_diag_m(m, system), "diag");
  if (ref_matrix_eig(system, 0) < floor || ref_matrix_eig(system, 1) < floor ||
      ref_matrix_eig(system, 2) < floor) {
    printf("eigs %e %e %e\n", ref_matrix_eig(system, 0),
           ref_matrix_eig(system, 1), ref_matrix_eig(system, 2));
    RSS(ref_matrix_show_m(m), "show");
    return REF_FAILURE;
  }

  return REF_SUCCESS;
}